

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_long(AMQP_VALUE value,int64_t *long_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || long_value == (int64_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x2a0;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_long",0x29f,1,"Bad arguments: value = %p, long_value = %p",value,
                long_value);
    }
  }
  else if (value->type == AMQP_TYPE_LONG) {
    *long_value = (int64_t)(value->value).described_value.descriptor;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x2a9;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_long",0x2a8,1,"Value is not of type LONG");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_long(AMQP_VALUE value, int64_t* long_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_077: [If any of the arguments is NULL then amqpvalue_get_long shall return a non-zero value.] */
    if ((value == NULL) ||
        (long_value == NULL))
    {
        LogError("Bad arguments: value = %p, long_value = %p",
            value, long_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_078: [If the type of the value is not long (was not created with amqpvalue_create_long), then amqpvalue_get_long shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_LONG)
        {
            LogError("Value is not of type LONG");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_075: [amqpvalue_get_long shall fill in the long_value argument the int64_t value stored by the AMQP value indicated by the value argument.] */
            *long_value = value_data->value.long_value;

            /* Codes_SRS_AMQPVALUE_01_076: [On success amqpvalue_get_long shall return 0.] */
            result = 0;
        }
    }

    return result;
}